

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall QtPromise::resolve<QByteArray>(QtPromise *this,QByteArray *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QByteArray>_> extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  QByteArray *local_18;
  QByteArray *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (QByteArray *)this;
  QPromise<QByteArray>::
  QPromise<QtPromise::resolve<QByteArray>(QByteArray&&)::_lambda(QtPromise::QPromiseResolve<QByteArray>&&,QtPromise::QPromiseReject<QByteArray>&&)_1_>
            ((QPromise<QByteArray> *)this,&local_20);
  TVar1.super_QPromiseBase<QByteArray>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<QByteArray>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<QByteArray>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}